

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MES.cpp
# Opt level: O3

void * MESThread(void *pParam)

{
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  size_t sVar8;
  ulong uVar9;
  SOCKET SVar10;
  char *pcVar11;
  double distance;
  CHRONO chrono_period;
  MES mes;
  char szTemp [256];
  char szSaveFilePath [256];
  timespec local_7d8;
  int local_7c8;
  int local_7c4;
  double local_7c0;
  timespec local_7b8;
  long local_7a8;
  long lStack_7a0;
  long local_798;
  long lStack_790;
  timespec local_788;
  int local_778;
  MES local_770;
  char local_238 [256];
  char local_138 [264];
  
  local_7c0 = 0.0;
  memset(&local_770,0,0x538);
  iVar5 = clock_getres(4,&local_788);
  if ((iVar5 == 0) && (iVar5 = clock_gettime(4,&local_7b8), iVar5 == 0)) {
    local_778 = 0;
    local_7a8 = 0;
    lStack_7a0 = 0;
    local_798 = 0;
    lStack_790 = 0;
  }
  iVar5 = 100;
  bVar2 = false;
  local_7c8 = 0;
  do {
    bVar2 = !bVar2;
    local_7c4 = iVar5;
    while( true ) {
      if (local_778 == 0) {
        clock_gettime(4,&local_7d8);
        local_7a8 = local_7d8.tv_sec;
        lStack_7a0 = local_7d8.tv_nsec;
        local_7d8.tv_sec =
             ((local_7d8.tv_sec + local_798) - local_7b8.tv_sec) +
             (local_7d8.tv_nsec + lStack_790) / 1000000000;
        local_7d8.tv_nsec = (local_7d8.tv_nsec + lStack_790) % 1000000000 - local_7b8.tv_nsec;
        if (local_7d8.tv_nsec < 0) {
          local_7d8.tv_sec = local_7d8.tv_sec + ~((ulong)-local_7d8.tv_nsec / 1000000000);
          local_7d8.tv_nsec =
               local_7d8.tv_nsec + 1000000000 +
               ((ulong)-local_7d8.tv_nsec / 1000000000) * 1000000000;
        }
        local_798 = local_7d8.tv_sec;
        lStack_790 = local_7d8.tv_nsec;
      }
      iVar6 = clock_getres(4,&local_788);
      if ((iVar6 == 0) && (iVar6 = clock_gettime(4,&local_7b8), iVar6 == 0)) {
        local_778 = 0;
        local_798 = 0;
        lStack_790 = 0;
        local_7a8 = 0;
        lStack_7a0 = 0;
      }
      local_7d8.tv_sec = (long)(iVar5 / 1000);
      local_7d8.tv_nsec = (long)((iVar5 % 1000) * 1000000);
      nanosleep(&local_7d8,(timespec *)0x0);
      iVar6 = local_7c4;
      if (bPauseMES == 0) break;
      if (!bVar2) {
        puts("MES paused.");
        SVar10 = local_770.RS232Port.s;
        switch(local_770.RS232Port.DevType) {
        case 0:
          iVar6 = (int)local_770.RS232Port.hDev;
          goto LAB_001c14e4;
        case 1:
        case 3:
          iVar6 = local_770.RS232Port.s;
          break;
        case 2:
          shutdown(local_770.RS232Port.s,2);
          close(SVar10);
        case 4:
          iVar6 = local_770.RS232Port.s_srv;
          break;
        default:
          goto switchD_001c14af_default;
        }
        shutdown(iVar6,2);
LAB_001c14e4:
        iVar6 = close(iVar6);
        pcVar11 = "MES disconnected.";
        if (iVar6 != 0) {
switchD_001c14af_default:
          pcVar11 = "MES disconnection failed.";
        }
        puts(pcVar11);
      }
      if (bExit != 0) goto LAB_001c186d;
      local_7d8.tv_sec = 0;
      local_7d8.tv_nsec = 100000000;
      nanosleep(&local_7d8,(timespec *)0x0);
      bVar2 = true;
    }
    if (bRestartMES == 0) {
      if (bVar2) goto LAB_001c1680;
      iVar5 = GetLatestDataMES(&local_770,&local_7c0);
      if (iVar5 == 0) {
        pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
        altitude_AGL = local_7c0;
        pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
        iVar5 = iVar6;
        goto LAB_001c173e;
      }
      puts("Connection to a MES lost.");
      SVar10 = local_770.RS232Port.s;
      iVar7 = local_7c8;
      switch(local_770.RS232Port.DevType) {
      case 0:
        iVar5 = (int)local_770.RS232Port.hDev;
        goto LAB_001c183b;
      case 1:
      case 3:
        iVar5 = local_770.RS232Port.s;
        break;
      case 2:
        shutdown(local_770.RS232Port.s,2);
        close(SVar10);
      case 4:
        iVar5 = local_770.RS232Port.s_srv;
        break;
      default:
        goto switchD_001c15e9_default;
      }
      shutdown(iVar5,2);
LAB_001c183b:
      iVar5 = close(iVar5);
      pcVar11 = "MES disconnected.";
      if (iVar5 != 0) {
switchD_001c15e9_default:
        pcVar11 = "MES disconnection failed.";
      }
      puts(pcVar11);
LAB_001c16b5:
      if (ExitOnErrorCount <= iVar7 + 1 && 0 < ExitOnErrorCount) {
        bExit = 1;
LAB_001c186d:
        bVar3 = true;
        break;
      }
      bVar2 = false;
      bVar3 = true;
      iVar5 = iVar6;
      local_7c8 = iVar7 + 1;
    }
    else {
      if (!bVar2) {
        puts("Restarting a MES.");
        SVar10 = local_770.RS232Port.s;
        switch(local_770.RS232Port.DevType) {
        case 0:
          iVar5 = (int)local_770.RS232Port.hDev;
          goto LAB_001c1654;
        case 1:
        case 3:
          iVar5 = local_770.RS232Port.s;
          break;
        case 2:
          shutdown(local_770.RS232Port.s,2);
          close(SVar10);
        case 4:
          iVar5 = local_770.RS232Port.s_srv;
          break;
        default:
          goto switchD_001c1584_default;
        }
        shutdown(iVar5,2);
LAB_001c1654:
        iVar5 = close(iVar5);
        pcVar11 = "MES disconnected.";
        if (iVar5 != 0) {
switchD_001c1584_default:
          pcVar11 = "MES disconnection failed.";
        }
        puts(pcVar11);
      }
      bRestartMES = 0;
LAB_001c1680:
      iVar7 = ConnectMES(&local_770,"MES0.txt");
      iVar5 = local_770.threadperiod;
      if (iVar7 != 0) {
        local_7d8.tv_sec = 1;
        local_7d8.tv_nsec = 0;
        nanosleep(&local_7d8,(timespec *)0x0);
        iVar7 = local_7c8;
        goto LAB_001c16b5;
      }
      if ((FILE *)local_770.pfSaveFile != (FILE *)0x0) {
        fclose((FILE *)local_770.pfSaveFile);
        local_770.pfSaveFile = (FILE *)0x0;
      }
      bVar2 = true;
      if (local_770.bSaveRawData == 0) {
LAB_001c173e:
        bVar2 = true;
        bVar3 = false;
      }
      else {
        if (local_770.szCfgFilePath[0] == '\0') {
          builtin_strncpy(local_238,"mes",4);
        }
        else {
          sprintf(local_238,"%.127s",local_770.szCfgFilePath);
        }
        sVar8 = strlen(local_238);
        iVar6 = (int)sVar8 + 1;
        uVar9 = sVar8 & 0xffffffff;
        do {
          if ((int)uVar9 < 1) goto LAB_001c1798;
          uVar1 = uVar9 - 1;
          iVar6 = iVar6 + -1;
          lVar4 = uVar9 - 1;
          uVar9 = uVar1;
        } while (local_238[lVar4] != '.');
        if ((uVar1 != 0) && (iVar6 <= (int)sVar8)) {
          memset(local_238 + (uVar1 & 0xffffffff),0,sVar8 - (uVar1 & 0xffffffff));
        }
LAB_001c1798:
        pthread_mutex_lock((pthread_mutex_t *)&strtimeCS);
        pcVar11 = strtimeex_fns();
        bVar3 = false;
        sprintf(local_138,"log/%.127s_%.64s.txt",local_238,pcVar11);
        pthread_mutex_unlock((pthread_mutex_t *)&strtimeCS);
        local_770.pfSaveFile = (FILE *)fopen(local_138,"wb");
        if ((FILE *)local_770.pfSaveFile == (FILE *)0x0) {
          puts("Unable to create MES data file.");
          bVar3 = false;
          break;
        }
      }
    }
  } while (bExit == 0);
  if (local_778 == 0) {
    clock_gettime(4,&local_7d8);
    local_7a8 = local_7d8.tv_sec;
    lStack_7a0 = local_7d8.tv_nsec;
    local_7d8.tv_sec =
         ((local_7d8.tv_sec + local_798) - local_7b8.tv_sec) +
         (local_7d8.tv_nsec + lStack_790) / 1000000000;
    local_7d8.tv_nsec = (local_7d8.tv_nsec + lStack_790) % 1000000000 - local_7b8.tv_nsec;
    if (local_7d8.tv_nsec < 0) {
      local_7d8.tv_sec = local_7d8.tv_sec + ~((ulong)-local_7d8.tv_nsec / 1000000000);
      local_7d8.tv_nsec =
           local_7d8.tv_nsec + 1000000000 + ((ulong)-local_7d8.tv_nsec / 1000000000) * 1000000000;
    }
    local_798 = local_7d8.tv_sec;
    lStack_790 = local_7d8.tv_nsec;
  }
  if ((FILE *)local_770.pfSaveFile != (FILE *)0x0) {
    fclose((FILE *)local_770.pfSaveFile);
    local_770.pfSaveFile = (FILE *)0x0;
  }
  if (bVar3) goto LAB_001c19bd;
  switch(local_770.RS232Port.DevType) {
  case 0:
    goto LAB_001c199d;
  case 1:
  case 3:
    SVar10 = local_770.RS232Port.s;
    break;
  case 2:
    shutdown(local_770.RS232Port.s,2);
    close(local_770.RS232Port.s);
  case 4:
    SVar10 = local_770.RS232Port.s_srv;
    break;
  default:
    goto switchD_001c196e_default;
  }
  shutdown(SVar10,2);
  local_770.RS232Port.hDev._0_4_ = SVar10;
LAB_001c199d:
  iVar5 = close((int)local_770.RS232Port.hDev);
  if (iVar5 == 0) {
    pcVar11 = "MES disconnected.";
  }
  else {
switchD_001c196e_default:
    pcVar11 = "MES disconnection failed.";
  }
  puts(pcVar11);
LAB_001c19bd:
  if (bExit == 0) {
    bExit = 1;
  }
  return (void *)0x0;
}

Assistant:

THREAD_PROC_RETURN_VALUE MESThread(void* pParam)
{
	MES mes;
	double distance = 0;
	BOOL bConnected = FALSE;
	CHRONO chrono_period;
	int threadperiod = 100;
	int errcount = 0;
	int i = 0;
	char szSaveFilePath[256];
	char szTemp[256];

	UNREFERENCED_PARAMETER(pParam);

	memset(&mes, 0, sizeof(MES));

	StartChrono(&chrono_period);

	for (;;)
	{
		StopChronoQuick(&chrono_period);
		StartChrono(&chrono_period);

		mSleep(threadperiod);

		if (bPauseMES)
		{
			if (bConnected)
			{
				printf("MES paused.\n");
				bConnected = FALSE;
				DisconnectMES(&mes);
			}
			if (bExit) break;
			mSleep(100);
			continue;
		}

		if (bRestartMES)
		{
			if (bConnected)
			{
				printf("Restarting a MES.\n");
				bConnected = FALSE;
				DisconnectMES(&mes);
			}
			bRestartMES = FALSE;
		}

		if (!bConnected)
		{
			if (ConnectMES(&mes, "MES0.txt") == EXIT_SUCCESS) 
			{
				bConnected = TRUE; 
				threadperiod = mes.threadperiod;

				if (mes.pfSaveFile != NULL)
				{
					fclose(mes.pfSaveFile); 
					mes.pfSaveFile = NULL;
				}
				if ((mes.bSaveRawData)&&(mes.pfSaveFile == NULL)) 
				{
					if (strlen(mes.szCfgFilePath) > 0)
					{
						sprintf(szTemp, "%.127s", mes.szCfgFilePath);
					}
					else
					{
						sprintf(szTemp, "mes");
					}
					// Remove the extension.
					for (i = (int)strlen(szTemp)-1; i >= 0; i--) { if (szTemp[i] == '.') break; }
					if ((i > 0)&&(i < (int)strlen(szTemp))) memset(szTemp+i, 0, strlen(szTemp)-i);
					//if (strlen(szTemp) > 4) memset(szTemp+strlen(szTemp)-4, 0, 4);
					EnterCriticalSection(&strtimeCS);
					sprintf(szSaveFilePath, LOG_FOLDER"%.127s_%.64s.txt", szTemp, strtimeex_fns());
					LeaveCriticalSection(&strtimeCS);
					mes.pfSaveFile = fopen(szSaveFilePath, "wb");
					if (mes.pfSaveFile == NULL) 
					{
						printf("Unable to create MES data file.\n");
						break;
					}
				}
			}
			else 
			{
				bConnected = FALSE;
				mSleep(1000);
			}
		}
		else
		{
			if (GetLatestDataMES(&mes, &distance) == EXIT_SUCCESS)
			{
				EnterCriticalSection(&StateVariablesCS);

				altitude_AGL = distance;

				LeaveCriticalSection(&StateVariablesCS);
			}
			else
			{
				printf("Connection to a MES lost.\n");
				bConnected = FALSE;
				DisconnectMES(&mes);
			}
		}

		//printf("MESThread period : %f s.\n", GetTimeElapsedChronoQuick(&chrono_period));
		if (!bConnected) { errcount++; if ((ExitOnErrorCount > 0)&&(errcount >= ExitOnErrorCount)) bExit = TRUE; }
		if (bExit) break;
	}

	StopChronoQuick(&chrono_period);

	if (mes.pfSaveFile != NULL)
	{
		fclose(mes.pfSaveFile); 
		mes.pfSaveFile = NULL;
	}

	if (bConnected) DisconnectMES(&mes);

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}